

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::ZConsVisitor::readZconsFile(ZConsVisitor *this,RealType time)

{
  bool bVar1;
  long in_RDI;
  double in_XMM0_Qa;
  RealType RVar2;
  RealType tempTime;
  ZConsReader *in_stack_000007e0;
  
  while ((bVar1 = ZConsReader::hasNextFrame((ZConsReader *)0x353f4a), bVar1 &&
         (RVar2 = ZConsReader::getCurTime(*(ZConsReader **)(in_RDI + 0xa0)), RVar2 < in_XMM0_Qa))) {
    ZConsReader::readNextFrame(in_stack_000007e0);
  }
  return;
}

Assistant:

void ZConsVisitor::readZconsFile(RealType time) {
    RealType tempTime;
    while (zconsReader_->hasNextFrame()) {
      tempTime = zconsReader_->getCurTime();
      if (tempTime >= time) { return; }

      zconsReader_->readNextFrame();
    }
  }